

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

int NULLCTypeInfo::IsClass(int id)

{
  ExternTypeInfo *pEVar1;
  int id_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),id);
    return (int)(pEVar1->subCat == CAT_CLASS);
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x85,"int NULLCTypeInfo::IsClass(int)");
}

Assistant:

int IsClass(int id)
	{
		assert(linker);
		return linker->exTypes[id].subCat == ExternTypeInfo::CAT_CLASS;
	}